

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmAddEaRg<(moira::Instr)119,(moira::Mode)3,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  StrWriter *pSVar1;
  Ea<(moira::Mode)3,_2> src;
  u32 local_34;
  ushort local_30;
  
  local_30 = op & 7;
  local_34 = *addr;
  pSVar1 = StrWriter::operator<<(str);
  pSVar1 = StrWriter::operator<<(pSVar1);
  StrWriter::operator<<(pSVar1,(Tab)(str->tab).raw);
  StrWriter::operator<<(pSVar1,(Ea<(moira::Mode)3,_2> *)&local_34);
  StrWriter::operator<<(pSVar1);
  StrWriter::operator<<(pSVar1,(Dn)((op & 0xe00) >> 9));
  return;
}

Assistant:

void
Moira::dasmAddEaRg(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = Op <M,S> ( _____________xxx(op), addr );
    auto dst = Dn       ( ____xxx_________(op)       );

    str << Ins<I>{} << Sz<S>{} << str.tab << src << Sep{} << dst;
}